

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O1

void uhash_close_63(UHashtable *hash)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (hash != (UHashtable *)0x0) {
    if (hash->elements != (UHashElement *)0x0) {
      if ((hash->keyDeleter != (UObjectDeleter *)0x0) ||
         (hash->valueDeleter != (UObjectDeleter *)0x0)) {
        iVar4 = -1;
LAB_002b580b:
        lVar2 = (long)iVar4;
        lVar1 = lVar2 * 0x18;
        iVar3 = iVar4;
        do {
          lVar5 = lVar1;
          lVar2 = lVar2 + 1;
          if (hash->length <= lVar2) {
            lVar5 = 0;
            goto LAB_002b5849;
          }
          iVar3 = iVar3 + 1;
          lVar1 = lVar5 + 0x18;
        } while (*(int *)((long)&hash->elements[1].hashcode + lVar5) < 0);
        lVar5 = (long)&hash->elements[1].hashcode + lVar5;
        iVar4 = iVar3;
LAB_002b5849:
        if (lVar5 != 0) {
          if ((hash->keyDeleter != (UObjectDeleter *)0x0) &&
             (*(void **)(lVar5 + 0x10) != (void *)0x0)) {
            (*hash->keyDeleter)(*(void **)(lVar5 + 0x10));
          }
          if ((hash->valueDeleter != (UObjectDeleter *)0x0) &&
             (*(void **)(lVar5 + 8) != (void *)0x0)) {
            (*hash->valueDeleter)(*(void **)(lVar5 + 8));
          }
          goto LAB_002b580b;
        }
      }
      uprv_free_63(hash->elements);
      hash->elements = (UHashElement *)0x0;
    }
    if (hash->allocated != '\0') {
      uprv_free_63(hash);
      return;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uhash_close(UHashtable *hash) {
    if (hash == NULL) {
        return;
    }
    if (hash->elements != NULL) {
        if (hash->keyDeleter != NULL || hash->valueDeleter != NULL) {
            int32_t pos=UHASH_FIRST;
            UHashElement *e;
            while ((e = (UHashElement*) uhash_nextElement(hash, &pos)) != NULL) {
                HASH_DELETE_KEY_VALUE(hash, e->key.pointer, e->value.pointer);
            }
        }
        uprv_free(hash->elements);
        hash->elements = NULL;
    }
    if (hash->allocated) {
        uprv_free(hash);
    }
}